

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O0

int __thiscall MatroskaDemuxer::matroska_parse_cluster(MatroskaDemuxer *this)

{
  uint8_t *local_48;
  int64_t num;
  int64_t iStack_38;
  int size;
  int64_t pos;
  uint8_t *data;
  int64_t cluster_time;
  uint32_t id;
  int res;
  MatroskaDemuxer *this_local;
  
  cluster_time._4_4_ = 0;
  data = (uint8_t *)0x0;
  _id = this;
  do {
    if (cluster_time._4_4_ != 0) {
      return cluster_time._4_4_;
    }
    cluster_time._0_4_ = ebml_peek_id(this,&this->level_up);
    if ((uint32_t)cluster_time == 0) {
      return -1;
    }
    if (this->level_up != 0) {
      this->level_up = this->level_up + -1;
      return cluster_time._4_4_;
    }
    if ((uint32_t)cluster_time == 0xa0) {
      cluster_time._4_4_ = ebml_read_master(this,(uint32_t *)&cluster_time);
      if (-1 < cluster_time._4_4_) {
        cluster_time._4_4_ = matroska_parse_blockgroup(this,(int64_t)data);
      }
    }
    else if ((uint32_t)cluster_time == 0xa3) {
      iStack_38 = (this->super_IOContextDemuxer).m_processedBytes;
      cluster_time._4_4_ =
           ebml_read_binary(this,(uint32_t *)&cluster_time,(uint8_t **)&pos,(int *)((long)&num + 4))
      ;
      if (cluster_time._4_4_ == 0) {
        cluster_time._4_4_ =
             matroska_parse_block
                       (this,(uint8_t *)pos,num._4_4_,iStack_38,(int64_t)data,-0x8000000000000000,-1
                        ,0);
      }
    }
    else if ((uint32_t)cluster_time == 0xbf) {
LAB_002c77c2:
      cluster_time._4_4_ = ebml_read_skip(this);
    }
    else if ((uint32_t)cluster_time == 0xe7) {
      cluster_time._4_4_ = ebml_read_uint(this,(uint32_t *)&cluster_time,(int64_t *)&local_48);
      if (-1 < cluster_time._4_4_) {
        data = local_48;
      }
    }
    else {
      if ((uint32_t)cluster_time == 0xec) goto LAB_002c77c2;
      if ((uint32_t)cluster_time == 0x1f43b675) {
        return 0;
      }
      cluster_time._4_4_ = ebml_read_skip(this);
    }
    if (this->level_up != 0) {
      this->level_up = this->level_up + -1;
      return cluster_time._4_4_;
    }
  } while( true );
}

Assistant:

int MatroskaDemuxer::matroska_parse_cluster()
{
    int res = 0;
    uint32_t id;
    int64_t cluster_time = 0;
    uint8_t *data;
    int64_t pos;
    int size;

    while (res == 0)
    {
        if ((id = ebml_peek_id(&level_up)) == 0)
        {
            res = -BufferedReader::DATA_EOF;
            break;
        }
        if (level_up)
        {
            level_up--;
            break;
        }

        switch (id)
        {
        /* cluster timecode */
        case MATROSKA_ID_CLUSTERTIMECODE:
        {
            int64_t num;
            if ((res = ebml_read_uint(&id, &num)) < 0)
                break;
            cluster_time = num;
            break;
        }

        /* a group of blocks inside a cluster */
        case MATROSKA_ID_BLOCKGROUP:
            if ((res = ebml_read_master(&id)) < 0)
                break;
            res = matroska_parse_blockgroup(cluster_time);
            break;

        case MATROSKA_ID_SIMPLEBLOCK:
            pos = m_processedBytes;
            res = ebml_read_binary(&id, &data, &size);
            if (res == 0)
                res = matroska_parse_block(data, size, pos, cluster_time, AV_NOPTS_VALUE, -1, 0);
            break;

        case EBML_ID_VOID:
        case EBML_ID_CRC32:
            res = ebml_read_skip();
            break;
        // Don't know why here is the next cluster without level up. Probably file error
        // TODO: does the EBML need to be skipped ?
        case MATROSKA_ID_CLUSTER:
            return 0;
        default:
            LTRACE(LT_WARN, 0, "Unknown entry " << id << " in cluster data");
            res = ebml_read_skip();
        }

        if (level_up)
        {
            level_up--;
            break;
        }
    }

    return res;
}